

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::StreamWriterBuilder::StreamWriterBuilder(StreamWriterBuilder *this)

{
  StreamWriterBuilder *this_local;
  
  StreamWriter::Factory::Factory(&this->super_Factory);
  (this->super_Factory)._vptr_Factory = (_func_int **)&PTR__StreamWriterBuilder_001ae6d8;
  Value::Value(&this->settings_,nullValue);
  setDefaults(&this->settings_);
  return;
}

Assistant:

StreamWriterBuilder::StreamWriterBuilder() { setDefaults(&settings_); }